

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variablesio.cpp
# Opt level: O2

void __thiscall
bal::VariableTextReader::read_variable_sequence_
          (VariableTextReader *this,uint *sequence_size,int *step_size)

{
  bool bVar1;
  uint32_t uVar2;
  int32_t iVar3;
  
  *sequence_size = 1;
  *step_size = 0;
  TextReader::skip_space
            ((TextReader *)
             ((long)&this->_vptr_VariableTextReader + (long)this->_vptr_VariableTextReader[-3]));
  bVar1 = TextReader::is_symbol
                    ((TextReader *)
                     ((long)&this->_vptr_VariableTextReader +
                     (long)this->_vptr_VariableTextReader[-3]),'/');
  if (bVar1) {
    TextReader::skip_symbol
              ((TextReader *)
               ((long)&this->_vptr_VariableTextReader + (long)this->_vptr_VariableTextReader[-3]));
    TextReader::skip_space
              ((TextReader *)
               ((long)&this->_vptr_VariableTextReader + (long)this->_vptr_VariableTextReader[-3]));
    uVar2 = TextReader::read_uint32
                      ((TextReader *)
                       ((long)&this->_vptr_VariableTextReader +
                       (long)this->_vptr_VariableTextReader[-3]),0,0xffffffff);
    *sequence_size = uVar2;
    TextReader::skip_space
              ((TextReader *)
               ((long)&this->_vptr_VariableTextReader + (long)this->_vptr_VariableTextReader[-3]));
    bVar1 = TextReader::is_symbol
                      ((TextReader *)
                       ((long)&this->_vptr_VariableTextReader +
                       (long)this->_vptr_VariableTextReader[-3]),'/');
    if (bVar1) {
      TextReader::skip_symbol
                ((TextReader *)
                 ((long)&this->_vptr_VariableTextReader + (long)this->_vptr_VariableTextReader[-3]))
      ;
      TextReader::skip_space
                ((TextReader *)
                 ((long)&this->_vptr_VariableTextReader + (long)this->_vptr_VariableTextReader[-3]))
      ;
      iVar3 = TextReader::read_sint32
                        ((TextReader *)
                         ((long)&this->_vptr_VariableTextReader +
                         (long)this->_vptr_VariableTextReader[-3]));
      *step_size = iVar3;
      TextReader::skip_space
                ((TextReader *)
                 ((long)&this->_vptr_VariableTextReader + (long)this->_vptr_VariableTextReader[-3]))
      ;
      return;
    }
  }
  return;
}

Assistant:

inline void VariableTextReader::read_variable_sequence_(unsigned int& sequence_size, signed int& step_size) {
        sequence_size = 1;
        step_size = 0;
        
        skip_space();
        if (is_symbol('/')) {
            skip_symbol();
            skip_space();
            sequence_size = read_uint32();
            skip_space();
            if (is_symbol('/')) {
                skip_symbol();
                skip_space();
                step_size = read_sint32();
                skip_space();
            };
        };
    }